

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_modinfo.hpp
# Opt level: O2

bool __thiscall
ELFIO::modinfo_section_accessor_template<const_ELFIO::section>::get_attribute
          (modinfo_section_accessor_template<const_ELFIO::section> *this,Elf_Word no,string *field,
          string *value)

{
  ulong uVar1;
  
  uVar1 = (long)(this->content).
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->content).
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 6;
  if (no < uVar1) {
    std::__cxx11::string::_M_assign((string *)field);
    std::__cxx11::string::_M_assign((string *)value);
  }
  return no < uVar1;
}

Assistant:

bool
    get_attribute( Elf_Word no, std::string& field, std::string& value ) const
    {
        if ( no < content.size() ) {
            field = content[no].first;
            value = content[no].second;
            return true;
        }

        return false;
    }